

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzgeoelrefpattern.h
# Opt level: O2

void __thiscall
TPZGeoElRefPattern<pzgeom::TPZArc3D>::MidSideNodeIndices
          (TPZGeoElRefPattern<pzgeom::TPZArc3D> *this,int side,TPZVec<long> *indices)

{
  TPZReference *pTVar1;
  int iVar2;
  long *plVar3;
  long lVar4;
  int iVar5;
  long lVar6;
  long lVar7;
  int64_t iVar8;
  TPZAutoPointer<TPZRefPattern> local_168;
  TPZVec<TPZGeoElSideIndex> nodeIndexes;
  TPZManVector<TPZGeoElSide,_10> gelsides;
  
  pTVar1 = (this->fRefPattern).fRef;
  if ((pTVar1 != (TPZReference *)0x0) && (pTVar1->fPointer != (TPZRefPattern *)0x0)) {
    iVar2 = (**(code **)(*(long *)&(this->super_TPZGeoElRefLess<pzgeom::TPZArc3D>).super_TPZGeoEl +
                        0x1d0))();
    if (iVar2 != 0) {
      iVar2 = (**(code **)(*(long *)&(this->super_TPZGeoElRefLess<pzgeom::TPZArc3D>).super_TPZGeoEl
                          + 0x98))(this);
      if (iVar2 <= side) {
        TPZManVector<TPZGeoElSide,_10>::TPZManVector(&gelsides,0);
        nodeIndexes._vptr_TPZVec = (_func_int **)&PTR__TPZVec_016b7de0;
        nodeIndexes.fStore = (TPZGeoElSideIndex *)0x0;
        nodeIndexes.fNElements = 0;
        nodeIndexes.fNAlloc = 0;
        (**(code **)(*(long *)&(this->super_TPZGeoElRefLess<pzgeom::TPZArc3D>).super_TPZGeoEl +
                    0x2b0))(&local_168,this);
        TPZRefPattern::InternalNodesIndexes((local_168.fRef)->fPointer,side,&nodeIndexes);
        TPZAutoPointer<TPZRefPattern>::~TPZAutoPointer(&local_168);
        iVar8 = nodeIndexes.fNElements;
        (*indices->_vptr_TPZVec[3])(indices,nodeIndexes.fNElements);
        lVar6 = 0;
        if (iVar8 < 1) {
          iVar8 = lVar6;
        }
        lVar7 = 1;
        for (; iVar8 != lVar6; lVar6 = lVar6 + 1) {
          plVar3 = (long *)(**(code **)(*(long *)&(this->super_TPZGeoElRefLess<pzgeom::TPZArc3D>).
                                                  super_TPZGeoEl + 0x1f8))
                                     (this,*(int *)&(&(nodeIndexes.fStore)->super_TPZSavable)[lVar7]
                                                    ._vptr_TPZSavable + -1);
          iVar2 = (int)(&(nodeIndexes.fStore)->fGeoElIndex)[lVar7];
          iVar5 = iVar2;
          if ((&(nodeIndexes.fStore)->super_TPZSavable)[lVar7]._vptr_TPZSavable ==
              (_func_int **)0xffffffffffffffff) {
            iVar5 = -1;
          }
          if (iVar2 == -1) {
            iVar5 = -1;
          }
          lVar4 = (**(code **)(*plVar3 + 0xa8))(plVar3,iVar5);
          indices->fStore[lVar6] = lVar4;
          lVar7 = lVar7 + 3;
        }
        (*indices->_vptr_TPZVec[3])(indices,iVar8);
        TPZVec<TPZGeoElSideIndex>::~TPZVec(&nodeIndexes);
        TPZManVector<TPZGeoElSide,_10>::~TPZManVector(&gelsides);
        return;
      }
    }
  }
  (*indices->_vptr_TPZVec[3])(indices,0);
  return;
}

Assistant:

void TPZGeoElRefPattern<TGeo>::MidSideNodeIndices(int side,TPZVec<int64_t> &indices) const{
	if(!fRefPattern || !HasSubElement() || side < this->NCornerNodes()) {
		indices.Resize(0);
		return;
	}
	TPZManVector<TPZGeoElSide> gelsides;
	TPZVec<TPZGeoElSideIndex> nodeIndexes;
	this->GetRefPattern()->InternalNodesIndexes(side, nodeIndexes);
	
	int64_t nsub = nodeIndexes.NElements();
	indices.Resize(nsub);
	int64_t is;
	int64_t counter = 0;
	for(is=0; is<nsub; is++)
	{
		TPZGeoEl *subel = SubElement(nodeIndexes[is].ElementIndex() - 1);
		indices[counter] = subel->NodeIndex(nodeIndexes[is].Side());
		counter++;
	}
	indices.Resize(counter);
}